

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O1

void __thiscall
Fade::run(Fade *this,FadeAggregates *finalAggregates,
         vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
         *aggregateRegister,int *numberOfAggregatesPerNode,int *degreeOfLocalAggregates,
         bool *_onehotfeatures,bool *isDetermined,int *determinedBy)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer pvVar4;
  int *piVar5;
  Database pTVar6;
  FadeAttributes *pFVar7;
  double *pdVar8;
  map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
  *pmVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  FadeAggregates *pFVar12;
  FadeAggregates *pFVar13;
  int iVar14;
  uint uVar15;
  int *piVar16;
  int **ppiVar17;
  DTreeNode *pDVar18;
  ulong *puVar19;
  pointer pdVar20;
  int *piVar21;
  pointer *pppdVar22;
  int *__dest;
  DataType *__s;
  ulong *puVar23;
  _Base_ptr p_Var24;
  ostream *poVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  _Rb_tree_header *p_Var34;
  bool bVar35;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>,_bool>
  pVar36;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aggs;
  vector<int_*,_std::allocator<int_*>_> offs;
  allocator_type local_79;
  ulong local_78;
  FadeAggregates *local_70;
  long local_68;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_60;
  vector<int_*,_std::allocator<int_*>_> local_48;
  
  local_68 = (long)((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _root->_id;
  this->_numberOfAggregatesPerNode = numberOfAggregatesPerNode;
  this->_degreeOfLocalAggregates = degreeOfLocalAggregates;
  this->_onehotfeatures = _onehotfeatures;
  this->isDetermined = isDetermined;
  this->determinedBy = determinedBy;
  uVar33 = dfdb::params::NUM_OF_ATTRIBUTES;
  uVar27 = ((long)numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 3 + -1] +
           (long)numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 4 + -1]) * 4;
  if ((int)((long)numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 3 + -1] +
           (long)numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 4 + -1]) < 0) {
    uVar27 = 0xffffffffffffffff;
  }
  local_70 = finalAggregates;
  piVar16 = (int *)operator_new__(uVar27);
  this->_degreeOfCategoricalAggregateGroup = piVar16;
  this->_numberOfValues = 0;
  ppiVar17 = (int **)operator_new__(-(ulong)(uVar33 >> 0x3d != 0) | uVar33 << 3);
  this->_aggregateRegister = ppiVar17;
  if (dfdb::params::NUM_OF_ATTRIBUTES != 0) {
    uVar33 = 0;
    do {
      pDVar18 = DTree::getNode((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(int)uVar33);
      uVar32 = dfdb::params::NUM_OF_ATTRIBUTES;
      iVar1 = pDVar18->_numOfChildren;
      iVar14 = (this->_numberOfAggregatesPerNode + uVar33)[dfdb::params::NUM_OF_ATTRIBUTES * 2] *
               (iVar1 + 3U) + this->_numberOfAggregatesPerNode[uVar33] * (iVar1 + 2U);
      uVar27 = (long)iVar14 * 4;
      if (iVar14 < 0) {
        uVar27 = 0xffffffffffffffff;
      }
      piVar16 = (int *)operator_new__(uVar27);
      this->_aggregateRegister[uVar33] = piVar16;
      piVar16 = this->_numberOfAggregatesPerNode;
      piVar21 = this->_aggregateRegister[uVar33];
      pvVar4 = (aggregateRegister->
               super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar14 = 0;
      lVar29 = 0;
      do {
        if (0 < piVar16[uVar33]) {
          lVar31 = *(long *)&pvVar4[uVar33].super__Vector_base<int_*,_std::allocator<int_*>_>.
                             _M_impl.super__Vector_impl_data;
          lVar30 = 0;
          do {
            piVar21[iVar14 + lVar30] = *(int *)(*(long *)(lVar31 + lVar30 * 8) + lVar29 * 4);
            lVar30 = lVar30 + 1;
          } while (lVar30 < piVar16[uVar33]);
          iVar14 = iVar14 + (int)lVar30;
        }
        bVar35 = lVar29 == 0;
        lVar29 = lVar29 + 1;
      } while (bVar35);
      piVar16 = this->_numberOfAggregatesPerNode;
      if (0 < piVar16[uVar33]) {
        pvVar4 = (aggregateRegister->
                 super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar29 = 0;
        do {
          if (0 < iVar1) {
            lVar31 = *(long *)(*(long *)&pvVar4[uVar33].
                                         super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                         super__Vector_impl_data + lVar29 * 8);
            lVar30 = 0;
            do {
              piVar21[iVar14 + lVar30] = *(int *)(lVar31 + 8 + lVar30 * 4);
              lVar30 = lVar30 + 1;
            } while ((ulong)(iVar1 + 2U) - 2 != lVar30);
            iVar14 = iVar14 + (int)lVar30;
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 < piVar16[uVar33]);
      }
      pvVar4 = (aggregateRegister->
               super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar29 = 0;
      do {
        if (0 < numberOfAggregatesPerNode[uVar32 * 2 + uVar33]) {
          lVar31 = *(long *)&pvVar4[uVar33].super__Vector_base<int_*,_std::allocator<int_*>_>.
                             _M_impl.super__Vector_impl_data;
          lVar30 = 0;
          do {
            piVar21[iVar14 + lVar30] =
                 *(int *)(*(long *)(lVar31 + (piVar16[uVar33] + lVar30) * 8) + lVar29 * 4);
            lVar30 = lVar30 + 1;
          } while ((int)lVar30 < numberOfAggregatesPerNode[uVar32 * 2 + uVar33]);
          iVar14 = iVar14 + (int)lVar30;
        }
        bVar35 = lVar29 == 0;
        lVar29 = lVar29 + 1;
      } while (bVar35);
      if (0 < piVar16[uVar32 * 2 + uVar33]) {
        pvVar4 = (aggregateRegister->
                 super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar28 = 0;
        do {
          if (-1 < iVar1) {
            lVar29 = *(long *)&pvVar4[uVar33].super__Vector_base<int_*,_std::allocator<int_*>_>.
                               _M_impl.super__Vector_impl_data;
            lVar31 = 0;
            do {
              piVar21[iVar14 + lVar31] =
                   *(int *)(*(long *)(lVar29 + ((long)iVar28 + (long)piVar16[uVar33]) * 8) + 8 +
                           lVar31 * 4);
              lVar31 = lVar31 + 1;
            } while ((ulong)(iVar1 + 3U) - 2 != lVar31);
            iVar14 = iVar14 + (int)lVar31;
          }
          iVar28 = iVar28 + 1;
        } while (iVar28 < piVar16[uVar32 * 2 + uVar33]);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 < dfdb::params::NUM_OF_ATTRIBUTES);
  }
  uVar15 = (int)dfdb::params::NUM_OF_ATTRIBUTES - 1;
  if (-1 < (int)uVar15) {
    uVar33 = (ulong)uVar15;
    do {
      uVar27 = uVar33;
      pDVar18 = DTree::getNode((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(int)uVar27);
      uVar15 = pDVar18->_numOfChildren;
      pDVar18 = DTree::getNode((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,(int)uVar27);
      uVar33 = dfdb::params::NUM_OF_ATTRIBUTES;
      piVar16 = this->_numberOfAggregatesPerNode;
      iVar1 = piVar16[dfdb::params::NUM_OF_ATTRIBUTES * 2 + uVar27];
      if (0 < (long)iVar1) {
        piVar21 = pDVar18->_childrenIDs;
        iVar14 = piVar16[uVar27];
        iVar28 = piVar16[dfdb::params::NUM_OF_ATTRIBUTES * 3 + uVar27];
        pvVar4 = (aggregateRegister->
                 super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar27;
        lVar29 = *(long *)&(pvVar4->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
                           super__Vector_impl_data;
        piVar5 = this->_degreeOfCategoricalAggregateGroup;
        lVar31 = 0;
        do {
          if ((int)uVar15 < 1) {
            iVar26 = 0;
          }
          else {
            uVar32 = 0;
            iVar26 = 0;
            do {
              iVar2 = *(int *)(*(long *)(lVar31 * 8 +
                                         *(long *)&(pvVar4->
                                                  super__Vector_base<int_*,_std::allocator<int_*>_>)
                                                  ._M_impl.super__Vector_impl_data +
                                        (long)iVar14 * 8) + 8 + uVar32 * 4);
              if (piVar16[piVar21[uVar32]] <= iVar2) {
                iVar26 = iVar26 + this->_degreeOfCategoricalAggregateGroup
                                  [(iVar2 - piVar16[piVar21[uVar32]]) +
                                   piVar16[uVar33 * 3 + (long)piVar21[uVar32]]];
              }
              uVar32 = uVar32 + 1;
            } while (uVar15 != uVar32);
          }
          piVar5[iVar28 + lVar31] =
               (uint)(*(int *)(*(long *)((long)iVar14 * 8 + lVar29 + lVar31 * 8) + 8 +
                              (long)(int)uVar15 * 4) == 1) + iVar26;
          lVar31 = lVar31 + 1;
        } while (lVar31 != iVar1);
      }
      uVar33 = uVar27 - 1;
      local_78 = uVar27;
    } while (0 < (long)uVar27);
  }
  uVar33 = dfdb::params::NUM_OF_TABLES;
  uVar27 = (ulong)this->_numOfThreads;
  if (uVar27 < 2) {
    uVar27 = -(ulong)(dfdb::params::NUM_OF_TABLES >> 0x3e != 0) | dfdb::params::NUM_OF_TABLES * 4;
    piVar16 = (int *)operator_new__(uVar27);
    piVar21 = (int *)operator_new__(uVar27);
    pFVar12 = local_70;
    if (uVar33 != 0) {
      pppdVar22 = &(this->_data->super__Vector_base<double_*,_std::allocator<double_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
      uVar27 = 0;
      do {
        piVar16[uVar27] = 0;
        piVar21[uVar27] =
             (int)((ulong)((long)*pppdVar22 -
                          (long)((_Vector_impl_data *)(pppdVar22 + -1))->_M_start) >> 3) + -1;
        uVar27 = uVar27 + 1;
        pppdVar22 = pppdVar22 + 3;
      } while (uVar33 != uVar27);
    }
    runAggregator(this,piVar16,piVar21,0);
    lVar29 = local_68;
    std::vector<double,_std::allocator<double>_>::operator=
              (&pFVar12->categoricalAggregates,
               this->_aggregatesPerPartition->categoricalAggregates + local_68);
    uVar33 = dfdb::params::NUM_OF_ATTRIBUTES;
    piVar5 = this->_numberOfAggregatesPerNode;
    lVar29 = (long)piVar5[dfdb::params::NUM_OF_ATTRIBUTES * 2 + lVar29];
    if (0 < lVar29) {
      uVar27 = lVar29 << 2;
      __dest = (int *)operator_new__(uVar27);
      local_70->categoricalOffsets = __dest;
      memcpy(__dest,this->_aggregatesPerPartition->categoricalOffsets +
                    piVar5[uVar33 * 3 + local_68],uVar27);
    }
    operator_delete__(piVar16);
    operator_delete__(piVar21);
    lVar29 = local_68;
  }
  else {
    puVar19 = (ulong *)operator_new__(uVar27 * 8 + 8);
    *puVar19 = uVar27;
    puVar23 = puVar19 + 1;
    memset(puVar23,0,uVar27 * 8);
    pdVar20 = (pointer)getTableToPartition(this);
    if (this->_numOfThreads != 0) {
      pTVar6 = this->_data;
      lVar29 = 0;
      do {
        local_48.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_60.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
        ((local_60.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&PTR___State_00144c68;
        ((local_60.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)this;
        ((local_60.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)pTVar6;
        local_60.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = pdVar20;
        std::thread::_M_start_thread(&local_48,&local_60,0);
        if (local_60.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)((local_60.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[1])();
        }
        if (puVar23[lVar29] != 0) goto LAB_0012e367;
        puVar23[lVar29] =
             (ulong)local_48.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        lVar29 = lVar29 + 1;
      } while ((uint)lVar29 < this->_numOfThreads);
    }
    if (this->_numOfThreads != 0) {
      uVar33 = 0;
      do {
        std::thread::join();
        uVar33 = uVar33 + 1;
      } while (uVar33 < this->_numOfThreads);
    }
    lVar29 = local_68;
    if (*puVar19 != 0) {
      lVar31 = *puVar19 << 3;
      do {
        if (*(long *)((long)puVar19 + lVar31) != 0) {
LAB_0012e367:
          std::terminate();
        }
        lVar31 = lVar31 + -8;
      } while (lVar31 != 0);
    }
    operator_delete__(puVar19);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_60,(ulong)this->_numOfPartitions,(allocator_type *)&local_48);
    std::vector<int_*,_std::allocator<int_*>_>::vector
              (&local_48,(ulong)this->_numOfPartitions,&local_79);
    if (this->_numOfPartitions != 0) {
      lVar31 = 0;
      lVar30 = 0;
      uVar33 = 0;
      do {
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&((local_60.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar31),
                   (vector<double,_std::allocator<double>_> *)
                   (*(long *)((long)&this->_aggregatesPerPartition->categoricalAggregates + lVar30)
                   + lVar29 * 0x18));
        local_48.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar33] =
             *(int **)((long)&this->_aggregatesPerPartition->categoricalOffsets + lVar30);
        uVar33 = uVar33 + 1;
        lVar30 = lVar30 + 0x88;
        lVar31 = lVar31 + 0x18;
      } while (uVar33 < this->_numOfPartitions);
    }
    uVar33 = 0xffffffffffffffff;
    if (-1 < (long)this->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 2 + lVar29]) {
      uVar33 = (long)this->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 2 + lVar29]
               * 4;
    }
    piVar16 = (int *)operator_new__(uVar33);
    local_70->categoricalOffsets = piVar16;
    mergeCategoricalValues(this,&local_70->categoricalAggregates,piVar16,&local_60,&local_48);
    if (local_48.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_60);
  }
  uVar27 = dfdb::params::NUM_OF_ATTRIBUTES;
  piVar21 = this->_numberOfAggregatesPerNode;
  piVar16 = piVar21 + lVar29;
  iVar1 = piVar16[dfdb::params::NUM_OF_ATTRIBUTES];
  uVar15 = this->_numOfPartitions;
  lVar29 = (long)*piVar16;
  uVar33 = lVar29 * 8;
  if (lVar29 < 0) {
    uVar33 = 0xffffffffffffffff;
  }
  __s = (DataType *)operator_new__(uVar33);
  memset(__s,0,uVar33);
  pFVar12 = local_70;
  if ((ulong)uVar15 != 0) {
    uVar3 = piVar21[local_68];
    pFVar7 = this->_aggregatesPerPartition;
    uVar33 = 0;
    do {
      if (0 < (int)uVar3) {
        pdVar8 = pFVar7[uVar33].aggregates;
        uVar32 = 0;
        do {
          __s[uVar32] = pdVar8[(long)iVar1 + uVar32] + __s[uVar32];
          uVar32 = uVar32 + 1;
        } while (uVar3 != uVar32);
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar15);
  }
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar27;
  local_70->aggregates = __s;
  uVar33 = 0xffffffffffffffff;
  if (SUB168(auVar10 * ZEXT816(0x30),8) == 0) {
    uVar33 = SUB168(auVar10 * ZEXT816(0x30),0) | 8;
  }
  puVar23 = (ulong *)operator_new__(uVar33);
  *puVar23 = uVar27;
  if (uVar27 != 0) {
    puVar19 = puVar23 + 2;
    lVar29 = uVar27 * 0x30;
    do {
      *(undefined4 *)puVar19 = 0;
      puVar19[1] = 0;
      puVar19[2] = (ulong)puVar19;
      puVar19[3] = (ulong)puVar19;
      puVar19[4] = 0;
      puVar19 = puVar19 + 6;
      lVar29 = lVar29 + -0x30;
    } while (lVar29 != 0);
  }
  pFVar12->functionalDependencies =
       (map<double,_std::set<double,_std::less<double>,_std::allocator<double>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>_>_>
        *)(puVar23 + 1);
  iVar1 = determinedBy[uVar27];
  uVar27 = (ulong)iVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar27;
  uVar33 = 0xffffffffffffffff;
  if (SUB168(auVar11 * ZEXT816(0x30),8) == 0) {
    uVar33 = SUB168(auVar11 * ZEXT816(0x30),0) | 8;
  }
  puVar23 = (ulong *)operator_new__(uVar33);
  pFVar13 = local_70;
  *puVar23 = uVar27;
  if (uVar27 != 0) {
    puVar19 = puVar23 + 2;
    lVar29 = uVar27 * 0x30;
    do {
      *(undefined4 *)puVar19 = 0;
      puVar19[1] = 0;
      puVar19[2] = (ulong)puVar19;
      puVar19[3] = (ulong)puVar19;
      puVar19[4] = 0;
      puVar19 = puVar19 + 6;
      lVar29 = lVar29 + -0x30;
    } while (lVar29 != 0);
  }
  pFVar12->determinantValueSet =
       (set<double,_std::less<double>,_std::allocator<double>_> *)(puVar23 + 1);
  if ((0 < iVar1) && (this->_numOfPartitions != 0)) {
    local_78 = 0;
    do {
      uVar33 = local_78;
      if (dfdb::params::NUM_OF_ATTRIBUTES != 0) {
        uVar27 = 0;
        do {
          if (isDetermined[uVar27] == true) {
            pmVar9 = this->_aggregatesPerPartition[uVar33].functionalDependencies;
            p_Var34 = &pmVar9[uVar27]._M_t._M_impl.super__Rb_tree_header;
            p_Var24 = pmVar9[uVar27]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((_Rb_tree_header *)p_Var24 != p_Var34) {
              iVar1 = determinedBy[uVar27];
              do {
                std::
                _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                ::_M_insert_range_unique<std::_Rb_tree_const_iterator<double>>
                          ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                            *)(pFVar13->determinantValueSet + determinedBy[iVar1]),
                           *(_Base_ptr *)(p_Var24 + 2),
                           (_Rb_tree_const_iterator<double>)&p_Var24[1]._M_left);
                pVar36 = std::
                         _Rb_tree<double,std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>,std::_Select1st<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>,std::less<double>,std::allocator<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>>
                         ::
                         _M_emplace_unique<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>&>
                                   ((_Rb_tree<double,std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>,std::_Select1st<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>,std::less<double>,std::allocator<std::pair<double_const,std::set<double,std::less<double>,std::allocator<double>>>>>
                                     *)(pFVar13->functionalDependencies + uVar27),
                                    (pair<const_double,_std::set<double,_std::less<double>,_std::allocator<double>_>_>
                                     *)(p_Var24 + 1));
                if (((undefined1  [16])pVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                  std::
                  _Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<double>>
                            ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                              *)&pVar36.first._M_node._M_node[1]._M_parent,
                             *(_Base_ptr *)(p_Var24 + 2),
                             (_Rb_tree_const_iterator<double>)&p_Var24[1]._M_left);
                }
                p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
              } while ((_Rb_tree_header *)p_Var24 != p_Var34);
            }
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 < dfdb::params::NUM_OF_ATTRIBUTES);
      }
      local_78 = local_78 + 1;
    } while (local_78 < this->_numOfPartitions);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DATA - Number of values in Factorised Representation: ",0x36);
  poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DATA - Number of values in Listing Representation: ",0x33);
  pFVar12 = local_70;
  poVar25 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DATA - Compression Factor: ",0x1b);
  poVar25 = std::ostream::_M_insert<double>
                      (((((double)CONCAT44(0x45300000,(int)(dfdb::params::NUM_OF_ATTRIBUTES >> 0x20)
                                          ) - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)dfdb::params::NUM_OF_ATTRIBUTES) -
                        4503599627370496.0)) * *pFVar12->aggregates) / (double)this->_numberOfValues
                      );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  return;
}

Assistant:

void Fade::run(
    FadeAggregates& finalAggregates, std::vector<std::vector<int*> >& aggregateRegister,
    int* numberOfAggregatesPerNode, int* degreeOfLocalAggregates, bool* _onehotfeatures,
    bool* isDetermined, int* determinedBy)
{
    int rootID = _dTree->_root->_id;
    
    _numberOfAggregatesPerNode = numberOfAggregatesPerNode;
    _degreeOfLocalAggregates = degreeOfLocalAggregates;

    this->_onehotfeatures = _onehotfeatures;
    this->isDetermined = isDetermined; 
    this->determinedBy = determinedBy; 

    _degreeOfCategoricalAggregateGroup =
        new int[_numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 4 - 1] +
                _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 - 1]];
    
    _numberOfValues = 0;
    
    /*
     * _aggregateRegister is used as a performance improvement for better
     * accessing of aggregateInfoPerNode
     */
    _aggregateRegister = new int*[NUM_OF_ATTRIBUTES];

    for (size_t attID = 0; attID < NUM_OF_ATTRIBUTES; ++attID)
    {
        int childCount = _dTree->getNode(attID)->_numOfChildren;

        int totalNumberOfAggregates =
            _numberOfAggregatesPerNode[attID] * (childCount + 2) +
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID] *
            (childCount + 3);

        _aggregateRegister[attID] = new int[totalNumberOfAggregates];

        int *info = _aggregateRegister[attID];
        int index = 0;

        for (int j = 0; j < 2; ++j)
        {
            for (int i = 0; i < _numberOfAggregatesPerNode[attID]; ++i)
            {
                info[index] = aggregateRegister[attID][i][j];
                ++index;
            }
        }

        for (int i = 0; i < _numberOfAggregatesPerNode[attID]; ++i)
        {
            for (int j = 2; j < childCount + 2; ++j)
            {
                info[index] = aggregateRegister[attID][i][j];
                ++index;
            }
        }

        for (int j = 0; j < 2; ++j)
        {
            for (int i = 0; i <
                     numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID]; ++i)
            {
                info[index] =
                    aggregateRegister[attID][_numberOfAggregatesPerNode[attID] + i][j];
                ++index;
            }
        }

        for (int i = 0; i <
                 _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID]; ++i)
        {
            for (int j = 2; j < childCount + 3; ++j)
            {
                info[index] =
                    aggregateRegister[attID][_numberOfAggregatesPerNode[attID] + i][j];
                ++index;
            }
        }
    }

        
    for (int attID = NUM_OF_ATTRIBUTES - 1; attID >= 0; --attID)
    {
        int childCount = _dTree->getNode(attID)->_numOfChildren;
        int *childIDs = _dTree->getNode(attID)->_childrenIDs;
        int catAggOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + attID];

        int numberOfContAggregates = _numberOfAggregatesPerNode[attID];
        int numberOfCatAggregates =
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES*2 + attID];

        for (int catAggNo = 0; catAggNo < numberOfCatAggregates; ++catAggNo)
        {
            int numCatParts = 0;
            for (int child = 0; child < childCount; ++child)
            {
                if (aggregateRegister[attID][numberOfContAggregates + catAggNo][child + 2] >=
                    _numberOfAggregatesPerNode[childIDs[child]])
                {

                    numCatParts +=
                        _degreeOfCategoricalAggregateGroup[
                            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + childIDs[child]] +
                            aggregateRegister[attID][numberOfContAggregates + catAggNo][child + 2] -
                            _numberOfAggregatesPerNode[childIDs[child]]];
                }
            }

            if (aggregateRegister[attID][numberOfContAggregates + catAggNo][childCount + 2] == 1)
                numCatParts += 1;

            _degreeOfCategoricalAggregateGroup[catAggOffset + catAggNo] = numCatParts;
        }
    }
    
    /* Spawn threads and do partitioning. */
    if (_numOfThreads > 1)
    {
        /* Array containing threads to run F on different partitions. */
        thread* fWorkers = new thread[_numOfThreads];

        /* Table to partition (only one table is partitioned to guarantee join
         * correctness). */
        size_t tableToPartition = getTableToPartition();

        DINFO(
            "INFO - engine: launching " + to_string(_numOfThreads)
            + " threads to process " + to_string(_numOfPartitions)
            + " partitions on table " + to_string(tableToPartition)
            + ".\n");

        /* This is needed for the lambda expression below - does not accept a
         * variable that is out of scope. */
        Database dataToProcess = _data;
        
        /* Launch threads to work on different partitions of the input data. */
        for (unsigned int fWorker = 0; fWorker < _numOfThreads; ++fWorker)
        {
            fWorkers[fWorker] =
                thread(
                    [this, dataToProcess, tableToPartition]()
                    {
                        /* Current partition to work on; increase value for next
                         * thread to fetch. */
                        unsigned int currentPartition =
                        _nextPartition.fetch_add(1, memory_order_relaxed);

                        /* Iterate while not all the partitions were processed. */
                        while (currentPartition < _numOfPartitions)
                        {
                            /* Set bounds for the different tables. */
                            int* lowerBounds = new int[NUM_OF_TABLES];
                            int* upperBounds = new int[NUM_OF_TABLES];
                            for (size_t table = 0; table < NUM_OF_TABLES; ++table)
                            {
                                /* This is not a table to partition; it will be
                                 * fully processed. */
                                if(table != tableToPartition)
                                {
                                    lowerBounds[table] = 0;
                                    upperBounds[table] = _data[table].size() - 1;
                                }
                                /* Table to partition; define bounds based on
                                 * current partition number. */
                                else
                                {
                                    lowerBounds[table] = (int)(_data[table].size() * ((double) currentPartition/_numOfPartitions));
                                    upperBounds[table] = (int)(_data[table].size() * ((double) (currentPartition+1)/_numOfPartitions)) - 1;
                                }

                            }


                            /* Launch Fade to compute Aggregates. */
                            runAggregator(lowerBounds, upperBounds, currentPartition);

                            /* Retrieve and increase value of current partition
                             * to work on. */
                            currentPartition = _nextPartition.fetch_add(1, memory_order_relaxed);

                            /* Clean up bound arrays. */
                            delete[] lowerBounds;
                            delete[] upperBounds;
                        }
                    });
        }

        /* Wait for all threads to finish their tasks. */
        for (unsigned int fWorker = 0; fWorker < _numOfThreads; ++fWorker)
        {
            fWorkers[fWorker].join();
        }

        /* Delete array of threads. */
        delete[] fWorkers;

        vector<vector<double> > aggs(_numOfPartitions);
        vector<int*> offs(_numOfPartitions);
        /* Launch threads to work on different partitions of the input data. */
        for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
        {
            aggs[partition] = _aggregatesPerPartition[partition].categoricalAggregates[rootID];			
            offs[partition] = _aggregatesPerPartition[partition].categoricalOffsets;
        }

        finalAggregates.categoricalOffsets =
            new int[_numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID]];
        
        mergeCategoricalValues(finalAggregates.categoricalAggregates,
                               finalAggregates.categoricalOffsets, aggs, offs);
    }
    else
    {
        /* Set bounds for the different tables: they cover the whole tables */
        int* lowerBounds = new int[NUM_OF_TABLES];
        int* upperBounds = new int[NUM_OF_TABLES];
        for (size_t table = 0; table < NUM_OF_TABLES; ++table)
        {
            lowerBounds[table] = 0;
            upperBounds[table] = _data[table].size() - 1;
        }

        /* Launch Fade to compute Aggregates. */
        runAggregator(lowerBounds, upperBounds, 0);

        /* Retrieving the final categorical aggregates. */
        finalAggregates.categoricalAggregates =
            _aggregatesPerPartition[0].categoricalAggregates[rootID];

        /* Retrieving the final number of categorical aggregate groups. */
        int numCatAggs = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID];

        /* Retrieving the final offsets for each categorical aggregate group. */
        if (numCatAggs > 0)
        {
            finalAggregates.categoricalOffsets = new int[numCatAggs];
            memcpy(finalAggregates.categoricalOffsets,
                   &_aggregatesPerPartition[0].categoricalOffsets[
                       _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + rootID]],
                   sizeof(int) * numCatAggs);
        }

        /* Clean up bound arrays. */
        delete[] lowerBounds;
        delete[] upperBounds;
    }

    int aggregateOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES + rootID];

    double numOfTuples = 0.0; 
    for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
    {
        numOfTuples += _aggregatesPerPartition[partition].aggregates[0];
    }

    /* Retrieve the aggregates from all the partitions and sum them up. */
    double* finalContinuousAggregates =
        new double[_numberOfAggregatesPerNode[rootID]]();

    for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
    {
        for (int aggregateNo = 0; aggregateNo <
                 _numberOfAggregatesPerNode[rootID]; ++aggregateNo)
            finalContinuousAggregates[aggregateNo] +=
                _aggregatesPerPartition[partition].aggregates[aggregateOffset + aggregateNo];
    }

    finalAggregates.aggregates = finalContinuousAggregates;


    finalAggregates.functionalDependencies = new map<double, set<double>>[NUM_OF_ATTRIBUTES];

    int numOfFDs = determinedBy[NUM_OF_ATTRIBUTES];
    finalAggregates.determinantValueSet = new set<double>[numOfFDs];

    if(numOfFDs > 0)
    {
        /* We combine the FDs from different partitions & collect the set of determinant values. */
        for (unsigned int partition = 0; partition < _numOfPartitions; ++partition)
        {
            for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
            {
                if (isDetermined[i])
                {
                    int determinantID = determinedBy[i];
                    for (auto& p : _aggregatesPerPartition[partition].functionalDependencies[i])
                    {
                        finalAggregates.determinantValueSet[determinedBy[determinantID]].insert(p.second.begin(), p.second.end());

                        auto insertPair = finalAggregates.functionalDependencies[i].insert(p);
                        if (!insertPair.second)
                            insertPair.first->second.insert(p.second.begin(), p.second.end());
                    }
                }
            }
        }
    }

    std::cout << "DATA - Number of values in Factorised Representation: " << _numberOfValues << "\n";
    std::cout << "DATA - Number of values in Listing Representation: " <<
        long(finalAggregates.aggregates[0] * NUM_OF_ATTRIBUTES) << std::endl;
    std::cout << std::fixed << "DATA - Compression Factor: "
              << (finalAggregates.aggregates[0] * NUM_OF_ATTRIBUTES) / _numberOfValues
              << std::endl;   
}